

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void * uhash_put_63(UHashtable *hash,void *key,void *value,UErrorCode *status)

{
  UHashTok UVar1;
  UHashTok valueholder;
  UHashTok keyholder;
  UErrorCode *status_local;
  void *value_local;
  void *key_local;
  UHashtable *hash_local;
  
  UVar1 = _uhash_put(hash,key,value,'\x03',status);
  return UVar1.pointer;
}

Assistant:

U_CAPI void* U_EXPORT2
uhash_put(UHashtable *hash,
          void* key,
          void* value,
          UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.pointer = key;
    valueholder.pointer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      HINT_KEY_POINTER | HINT_VALUE_POINTER,
                      status).pointer;
}